

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O0

int IDAGetSolution(void *ida_mem,sunrealtype t,N_Vector yret,N_Vector ypret)

{
  double dVar1;
  int iVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  IDAMem in_XMM0_Qa;
  int retval;
  int kord;
  int j;
  sunrealtype gam;
  sunrealtype d;
  sunrealtype c;
  sunrealtype delt;
  sunrealtype tp;
  sunrealtype tfuzz;
  IDAMem IDA_mem;
  int local_68;
  int local_64;
  double local_60;
  double local_58;
  double local_50;
  double local_38;
  int local_4;
  
  if (in_RDI == (char *)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0xd26,"IDAGetSolution",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else {
    local_38 = *(double *)(in_RDI + 8) * 100.0 *
               (ABS(*(double *)(in_RDI + 0x2a8)) + ABS(*(double *)(in_RDI + 0x290)));
    if (*(double *)(in_RDI + 0x290) <= 0.0 && *(double *)(in_RDI + 0x290) != 0.0) {
      local_38 = -local_38;
    }
    if (0.0 <= ((double)in_XMM0_Qa -
               ((*(double *)(in_RDI + 0x2a8) - *(double *)(in_RDI + 0x298)) - local_38)) *
               *(double *)(in_RDI + 0x290)) {
      local_68 = *(int *)(in_RDI + 0x26c);
      if (*(int *)(in_RDI + 0x26c) == 0) {
        local_68 = 1;
      }
      dVar1 = *(double *)(in_RDI + 0x2a8);
      local_50 = 1.0;
      local_58 = 0.0;
      local_60 = ((double)in_XMM0_Qa - dVar1) / *(double *)(in_RDI + 0x90);
      in_RDI[0x4b0] = '\0';
      in_RDI[0x4b1] = '\0';
      in_RDI[0x4b2] = '\0';
      in_RDI[0x4b3] = '\0';
      in_RDI[0x4b4] = '\0';
      in_RDI[0x4b5] = '\0';
      in_RDI[0x4b6] = -0x10;
      in_RDI[0x4b7] = '?';
      for (local_64 = 1; local_64 <= local_68; local_64 = local_64 + 1) {
        local_58 = local_58 * local_60 +
                   local_50 / *(double *)(in_RDI + (long)(local_64 + -1) * 8 + 0x90);
        local_50 = local_50 * local_60;
        local_60 = (((double)in_XMM0_Qa - dVar1) +
                   *(double *)(in_RDI + (long)(local_64 + -1) * 8 + 0x90)) /
                   *(double *)(in_RDI + (long)local_64 * 8 + 0x90);
        *(double *)(in_RDI + (long)local_64 * 8 + 0x4b0) = local_50;
        *(double *)(in_RDI + (long)(local_64 + -1) * 8 + 0x4e0) = local_58;
      }
      iVar2 = N_VLinearCombination(local_68 + 1,in_RDI + 0x4b0,in_RDI + 0x60,in_RSI);
      if (iVar2 == 0) {
        iVar2 = N_VLinearCombination(local_68,in_RDI + 0x4e0,in_RDI + 0x68,in_RDX);
        if (iVar2 == 0) {
          local_4 = 0;
        }
        else {
          local_4 = -0x1c;
        }
      }
      else {
        local_4 = -0x1c;
      }
    }
    else {
      IDAProcessError(in_XMM0_Qa,(int)(*(double *)(in_RDI + 0x2a8) - *(double *)(in_RDI + 0x298)),
                      *(int *)(in_RDI + 0x2a8),in_RDI,(char *)0xffffffe6,(char *)0xd33,
                      "IDAGetSolution",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                      ,
                      "Illegal value for t.t = %.15g is not between tcur - hold = %.15g and tcur = %.15g"
                     );
      local_4 = -0x1a;
    }
  }
  return local_4;
}

Assistant:

int IDAGetSolution(void* ida_mem, sunrealtype t, N_Vector yret, N_Vector ypret)
{
  IDAMem IDA_mem;
  sunrealtype tfuzz, tp, delt, c, d, gam;
  int j, kord, retval;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Check t for legality.  Here tn - hused is t_{n-1}. */

  tfuzz = HUNDRED * IDA_mem->ida_uround *
          (SUNRabs(IDA_mem->ida_tn) + SUNRabs(IDA_mem->ida_hh));
  if (IDA_mem->ida_hh < ZERO) { tfuzz = -tfuzz; }
  tp = IDA_mem->ida_tn - IDA_mem->ida_hused - tfuzz;
  if ((t - tp) * IDA_mem->ida_hh < ZERO)
  {
    IDAProcessError(IDA_mem, IDA_BAD_T, __LINE__, __func__, __FILE__, MSG_BAD_T,
                    t, IDA_mem->ida_tn - IDA_mem->ida_hused, IDA_mem->ida_tn);
    return (IDA_BAD_T);
  }

  /* Initialize kord = (kused or 1). */

  kord = IDA_mem->ida_kused;
  if (IDA_mem->ida_kused == 0) { kord = 1; }

  /* Accumulate multiples of columns phi[j] into yret and ypret. */

  delt = t - IDA_mem->ida_tn;
  c    = ONE;
  d    = ZERO;
  gam  = delt / IDA_mem->ida_psi[0];

  IDA_mem->ida_cvals[0] = c;
  for (j = 1; j <= kord; j++)
  {
    d   = d * gam + c / IDA_mem->ida_psi[j - 1];
    c   = c * gam;
    gam = (delt + IDA_mem->ida_psi[j - 1]) / IDA_mem->ida_psi[j];

    IDA_mem->ida_cvals[j]     = c;
    IDA_mem->ida_dvals[j - 1] = d;
  }

  retval = N_VLinearCombination(kord + 1, IDA_mem->ida_cvals, IDA_mem->ida_phi,
                                yret);
  if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

  retval = N_VLinearCombination(kord, IDA_mem->ida_dvals, IDA_mem->ida_phi + 1,
                                ypret);
  if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

  return (IDA_SUCCESS);
}